

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss_functions.cc
# Opt level: O3

float __thiscall
poisson_loss::getLoss(poisson_loss *this,shared_data *param_1,float prediction,float label)

{
  ostream *poVar1;
  float fVar2;
  float fVar3;
  
  if (label < 0.0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"You are using label ",0x14);
    poVar1 = std::ostream::_M_insert<double>((double)label);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1," but loss function expects label >= 0!",0x26);
    std::ios::widen((char)poVar1->_vptr_basic_ostream[-3] + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
  }
  fVar2 = expf(prediction);
  fVar3 = logf(label + 1e-06);
  fVar2 = (fVar3 - prediction) * label - (label - fVar2);
  return fVar2 + fVar2;
}

Assistant:

float getLoss(shared_data*, float prediction, float label)
  {
    if (label < 0.f)
      cout << "You are using label " << label << " but loss function expects label >= 0!" << endl;
    float exp_prediction = expf(prediction);
    // deviance is used instead of log-likelihood
    return 2 * (label * (logf(label + 1e-6f) - prediction) - (label - exp_prediction));
  }